

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_averages_and_directions.cpp
# Opt level: O2

void compute_avgs_and_dirs_4_comp(partition_info *pi,image_block *blk,partition_metrics *pm)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  float fVar5;
  float fVar6;
  uint8_t (*pauVar7) [216];
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar15;
  float fVar16;
  undefined1 auVar14 [16];
  float fVar17;
  float fVar18;
  float fVar20;
  float fVar21;
  undefined1 auVar19 [16];
  float fVar22;
  float fVar23;
  float fVar25;
  float fVar26;
  undefined1 auVar24 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vfloat4 partition_averages [4];
  vfloat4 local_68 [4];
  
  uVar4 = pi->partition_count;
  if ((ulong)uVar4 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x18a,
                  "void compute_avgs_and_dirs_4_comp(const partition_info &, const image_block &, partition_metrics *)"
                 );
  }
  compute_partition_averages_rgba(pi,blk,local_68);
  pauVar7 = pi->texels_of_partition;
  uVar8 = 0;
  while( true ) {
    if (uVar8 == uVar4) {
      return;
    }
    bVar2 = pi->partition_texel_count[uVar8];
    if ((ulong)bVar2 == 0) break;
    auVar1 = *(undefined1 (*) [16])local_68[uVar8].m;
    *(undefined1 (*) [16])pm[uVar8].avg.m = auVar1;
    auVar11 = ZEXT816(0) << 0x40;
    uVar9 = 0;
    auVar14 = ZEXT816(0) << 0x40;
    auVar19 = ZEXT816(0) << 0x40;
    auVar24 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar10 = auVar11._0_4_;
      fVar23 = auVar24._0_4_;
      fVar25 = auVar24._4_4_;
      fVar26 = auVar24._8_4_;
      fVar27 = auVar24._12_4_;
      fVar18 = auVar19._0_4_;
      fVar20 = auVar19._4_4_;
      fVar21 = auVar19._8_4_;
      fVar22 = auVar19._12_4_;
      fVar13 = auVar14._0_4_;
      fVar15 = auVar14._4_4_;
      fVar16 = auVar14._8_4_;
      fVar17 = auVar14._12_4_;
      fVar5 = auVar11._4_4_;
      fVar6 = auVar11._8_4_;
      fVar12 = auVar11._12_4_;
      if (bVar2 == uVar9) break;
      bVar3 = (*pauVar7)[uVar9];
      auVar11 = vinsertps_avx(ZEXT416((uint)blk->data_r[bVar3]),ZEXT416((uint)blk->data_g[bVar3]),
                              0x10);
      auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)blk->data_b[bVar3]),0x20);
      auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)blk->data_a[bVar3]),0x30);
      auVar29 = vsubps_avx(auVar11,auVar1);
      auVar28 = vcmpps_avx(ZEXT816(0) << 0x40,auVar29,1);
      uVar34 = auVar28._0_4_;
      auVar38._4_4_ = uVar34;
      auVar38._0_4_ = uVar34;
      auVar38._8_4_ = uVar34;
      auVar38._12_4_ = uVar34;
      auVar11 = vandps_avx(auVar38,auVar29);
      auVar24._0_4_ = auVar11._0_4_ + fVar23;
      auVar24._4_4_ = auVar11._4_4_ + fVar25;
      auVar24._8_4_ = auVar11._8_4_ + fVar26;
      auVar24._12_4_ = auVar11._12_4_ + fVar27;
      auVar11 = vshufps_avx(auVar28,auVar28,0x55);
      auVar11 = vandps_avx(auVar11,auVar29);
      auVar19._0_4_ = auVar11._0_4_ + fVar18;
      auVar19._4_4_ = auVar11._4_4_ + fVar20;
      auVar19._8_4_ = auVar11._8_4_ + fVar21;
      auVar19._12_4_ = auVar11._12_4_ + fVar22;
      auVar11 = vshufps_avx(auVar28,auVar28,0xaa);
      auVar11 = vandps_avx(auVar11,auVar29);
      auVar14._0_4_ = auVar11._0_4_ + fVar13;
      auVar14._4_4_ = auVar11._4_4_ + fVar15;
      auVar14._8_4_ = auVar11._8_4_ + fVar16;
      auVar14._12_4_ = auVar11._12_4_ + fVar17;
      auVar11 = vshufps_avx(auVar28,auVar28,0xff);
      auVar28 = vandps_avx(auVar11,auVar29);
      auVar11._0_4_ = fVar10 + auVar28._0_4_;
      auVar11._4_4_ = fVar5 + auVar28._4_4_;
      auVar11._8_4_ = fVar6 + auVar28._8_4_;
      auVar11._12_4_ = fVar12 + auVar28._12_4_;
      uVar9 = uVar9 + 1;
    }
    auVar28._0_4_ = fVar23 * fVar23;
    auVar28._4_4_ = fVar25 * fVar25;
    auVar28._8_4_ = fVar26 * fVar26;
    auVar28._12_4_ = fVar27 * fVar27;
    auVar1 = vshufpd_avx(auVar28,auVar28,1);
    auVar29._0_4_ = auVar28._0_4_ + auVar1._0_4_;
    auVar29._4_4_ = auVar28._4_4_ + auVar1._4_4_;
    auVar29._8_4_ = auVar28._8_4_ + auVar1._8_4_;
    auVar29._12_4_ = auVar28._12_4_ + auVar1._12_4_;
    auVar1 = vhaddps_avx(auVar29,auVar29);
    auVar31._0_4_ = fVar18 * fVar18;
    auVar31._4_4_ = fVar20 * fVar20;
    auVar31._8_4_ = fVar21 * fVar21;
    auVar31._12_4_ = fVar22 * fVar22;
    auVar28 = vshufpd_avx(auVar31,auVar31,1);
    auVar32._0_4_ = auVar31._0_4_ + auVar28._0_4_;
    auVar32._4_4_ = auVar31._4_4_ + auVar28._4_4_;
    auVar32._8_4_ = auVar31._8_4_ + auVar28._8_4_;
    auVar32._12_4_ = auVar31._12_4_ + auVar28._12_4_;
    auVar28 = vhaddps_avx(auVar32,auVar32);
    auVar30._0_4_ = auVar1._0_4_;
    auVar30._4_4_ = auVar30._0_4_;
    auVar30._8_4_ = auVar30._0_4_;
    auVar30._12_4_ = auVar30._0_4_;
    auVar35._0_4_ = fVar13 * fVar13;
    auVar35._4_4_ = fVar15 * fVar15;
    auVar35._8_4_ = fVar16 * fVar16;
    auVar35._12_4_ = fVar17 * fVar17;
    auVar1 = vshufpd_avx(auVar35,auVar35,1);
    auVar36._0_4_ = auVar1._0_4_ + auVar35._0_4_;
    auVar36._4_4_ = auVar1._4_4_ + auVar35._4_4_;
    auVar36._8_4_ = auVar1._8_4_ + auVar35._8_4_;
    auVar36._12_4_ = auVar1._12_4_ + auVar35._12_4_;
    auVar1 = vhaddps_avx(auVar36,auVar36);
    auVar33._0_4_ = auVar28._0_4_;
    auVar33._4_4_ = auVar33._0_4_;
    auVar33._8_4_ = auVar33._0_4_;
    auVar33._12_4_ = auVar33._0_4_;
    auVar37._0_4_ = auVar1._0_4_;
    auVar37._4_4_ = auVar37._0_4_;
    auVar37._8_4_ = auVar37._0_4_;
    auVar37._12_4_ = auVar37._0_4_;
    auVar39._0_4_ = fVar10 * fVar10;
    auVar39._4_4_ = fVar5 * fVar5;
    auVar39._8_4_ = fVar6 * fVar6;
    auVar39._12_4_ = fVar12 * fVar12;
    auVar1 = vshufpd_avx(auVar39,auVar39,1);
    auVar40._0_4_ = auVar39._0_4_ + auVar1._0_4_;
    auVar40._4_4_ = auVar39._4_4_ + auVar1._4_4_;
    auVar40._8_4_ = auVar39._8_4_ + auVar1._8_4_;
    auVar40._12_4_ = auVar39._12_4_ + auVar1._12_4_;
    auVar1 = vhaddps_avx(auVar40,auVar40);
    auVar41._0_4_ = auVar1._0_4_;
    auVar41._4_4_ = auVar41._0_4_;
    auVar41._8_4_ = auVar41._0_4_;
    auVar41._12_4_ = auVar41._0_4_;
    auVar1 = vcmpps_avx(auVar30,auVar33,1);
    auVar1 = vblendvps_avx(auVar24,auVar19,auVar1);
    auVar24 = vmaxps_avx(auVar33,auVar30);
    auVar19 = vcmpps_avx(auVar24,auVar37,1);
    auVar1 = vblendvps_avx(auVar1,auVar14,auVar19);
    auVar14 = vmaxps_avx(auVar37,auVar24);
    auVar14 = vcmpps_avx(auVar14,auVar41,1);
    auVar1 = vblendvps_avx(auVar1,auVar11,auVar14);
    *(undefined1 (*) [16])pm[uVar8].dir.m = auVar1;
    uVar8 = uVar8 + 1;
    pauVar7 = pauVar7 + 1;
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                ,0x194,
                "void compute_avgs_and_dirs_4_comp(const partition_info &, const image_block &, partition_metrics *)"
               );
}

Assistant:

void compute_avgs_and_dirs_4_comp(
	const partition_info& pi,
	const image_block& blk,
	partition_metrics pm[BLOCK_MAX_PARTITIONS]
) {
	int partition_count = pi.partition_count;
	promise(partition_count > 0);

	// Pre-compute partition_averages
	vfloat4 partition_averages[BLOCK_MAX_PARTITIONS];
	compute_partition_averages_rgba(pi, blk, partition_averages);

	for (int partition = 0; partition < partition_count; partition++)
	{
		const uint8_t *texel_indexes = pi.texels_of_partition[partition];
		unsigned int texel_count = pi.partition_texel_count[partition];
		promise(texel_count > 0);

		vfloat4 average = partition_averages[partition];
		pm[partition].avg = average;

		vfloat4 sum_xp = vfloat4::zero();
		vfloat4 sum_yp = vfloat4::zero();
		vfloat4 sum_zp = vfloat4::zero();
		vfloat4 sum_wp = vfloat4::zero();

		for (unsigned int i = 0; i < texel_count; i++)
		{
			unsigned int iwt = texel_indexes[i];
			vfloat4 texel_datum = blk.texel(iwt);
			texel_datum = texel_datum - average;

			vfloat4 zero = vfloat4::zero();

			vmask4 tdm0 = texel_datum.swz<0,0,0,0>() > zero;
			sum_xp += select(zero, texel_datum, tdm0);

			vmask4 tdm1 = texel_datum.swz<1,1,1,1>() > zero;
			sum_yp += select(zero, texel_datum, tdm1);

			vmask4 tdm2 = texel_datum.swz<2,2,2,2>() > zero;
			sum_zp += select(zero, texel_datum, tdm2);

			vmask4 tdm3 = texel_datum.swz<3,3,3,3>() > zero;
			sum_wp += select(zero, texel_datum, tdm3);
		}

		vfloat4 prod_xp = dot(sum_xp, sum_xp);
		vfloat4 prod_yp = dot(sum_yp, sum_yp);
		vfloat4 prod_zp = dot(sum_zp, sum_zp);
		vfloat4 prod_wp = dot(sum_wp, sum_wp);

		vfloat4 best_vector = sum_xp;
		vfloat4 best_sum = prod_xp;

		vmask4 mask = prod_yp > best_sum;
		best_vector = select(best_vector, sum_yp, mask);
		best_sum = select(best_sum, prod_yp, mask);

		mask = prod_zp > best_sum;
		best_vector = select(best_vector, sum_zp, mask);
		best_sum = select(best_sum, prod_zp, mask);

		mask = prod_wp > best_sum;
		best_vector = select(best_vector, sum_wp, mask);

		pm[partition].dir = best_vector;
	}
}